

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CommitBufferForInterpreter
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation,BYTE *pBuffer,size_t bufferSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  AutoRealOrFakeCriticalSection<CriticalSection> local_38;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  
  local_38.cs = &this->criticalSection;
  CCLock::Enter(&(local_38.cs)->super_CCLock);
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1a3,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  allocation->bytesUsed = allocation->bytesUsed + bufferSize;
  this->totalBytesCode = this->totalBytesCode + bufferSize;
  if (DAT_0145948a == '\x01') {
    Output::Trace(CustomHeapPhase,L"Setting execute permissions on 0x%p, allocation: 0x%p\n",pBuffer
                  ,allocation->allocation->address);
  }
  bVar2 = CheckCommitFaultInjection(this);
  if (!bVar2) {
    BVar3 = Memory::CustomHeap::
            Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
            ProtectAllocationWithExecuteReadOnly
                      (&this->allocationHeap,allocation->allocation,(char *)0x0);
    if (BVar3 != 0) {
      BVar3 = FlushInstructionCache(this->processHandle,pBuffer,bufferSize);
      bVar2 = BVar3 != 0;
      goto LAB_003ee2bc;
    }
  }
  bVar2 = false;
LAB_003ee2bc:
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_38);
  return bVar2;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBufferForInterpreter(TEmitBufferAllocation* allocation, _In_reads_bytes_(bufferSize) BYTE* pBuffer, _In_ size_t bufferSize)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(allocation != nullptr);
    allocation->bytesUsed += bufferSize;
#ifdef DEBUG
    this->totalBytesCode += bufferSize;
#endif

    VerboseHeapTrace(_u("Setting execute permissions on 0x%p, allocation: 0x%p\n"), pBuffer, allocation->allocation->address);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CheckCommitFaultInjection())
    {
        return false;
    }
#endif

    if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation))
    {
        return false;
    }

    if (!FlushInstructionCache(this->processHandle, pBuffer, bufferSize))
    {
        return false;
    }

    return true;
}